

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  ErrorFormat EVar1;
  pointer pbVar2;
  node_type *pnVar3;
  Descriptor *pDVar4;
  _func_int **pp_Var5;
  node_type *pnVar6;
  GeneratorContextImpl *this_00;
  pointer pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  _func_int ***ppp_Var10;
  _Head_base<0UL,_google::protobuf::DescriptorPool_*,_false> _Var11;
  pointer ppFVar12;
  undefined8 uVar13;
  pointer puVar14;
  bool bVar15;
  char cVar16;
  ParseArgumentStatus PVar17;
  int iVar18;
  int *piVar19;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar20;
  ostream *poVar21;
  char *pcVar22;
  size_t sVar23;
  MergedDescriptorDatabase *this_01;
  DiskSourceTree *this_02;
  MultiFileErrorCollector *pMVar24;
  SourceTreeDescriptorDatabase *this_03;
  DescriptorPool *pDVar25;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *proto;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar26;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar27;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *pVVar28;
  reference filename;
  pointer pOVar29;
  GeneratorContext *generator_context;
  void *pvVar30;
  FileDescriptor *pFVar31;
  Chunk *pCVar32;
  anon_union_8_1_a8a14541_for_iterator_2 arena;
  Arena *arena_00;
  Chunk *pCVar33;
  ErrorCollector *error_collector;
  DiskSourceTree *source_tree;
  FieldDescriptorProto *proto_01;
  pointer __p;
  long lVar34;
  undefined1 *puVar35;
  pointer pbVar36;
  long lVar37;
  FileDescriptor **file;
  ulong uVar38;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  __base_type _Var39;
  CommandLineInterface *pCVar40;
  string_view value;
  string_view value_00;
  string_view str;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  bool validation_error;
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  descriptor_pool;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  GeneratorContextMap output_directories;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  FileDescriptorSet file_descriptor_set;
  OptionTargetType in_stack_fffffffffffffd98;
  ctrl_t local_259;
  DiskSourceTree *local_258;
  _Head_base<0UL,_google::protobuf::DescriptorPool_*,_false> local_250;
  MultiFileErrorCollector *local_248;
  CommandLineInterface *local_240;
  SourceTreeDescriptorDatabase *local_238;
  MergedDescriptorDatabase *local_230;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_228;
  undefined1 local_208 [32];
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  local_1e8;
  Chunk *local_1c8;
  Chunk *local_1c0;
  undefined1 local_1b8 [72];
  RepeatedPtrFieldBase local_170;
  RepeatedPtrFieldBase local_158;
  RepeatedPtrFieldBase local_140 [3];
  ArenaStringPtr local_f0 [7];
  undefined1 local_b8 [40];
  RepeatedPtrFieldBase local_90 [3];
  LogMessageFatal local_40;
  
  Clear(this);
  PVar17 = ParseArguments(this,argc,argv);
  if (PVar17 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar17 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  local_228.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (MergedDescriptorDatabase *)0x0;
  local_228.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248 = (MultiFileErrorCollector *)0x0;
  local_250._M_head_impl = (DescriptorPool *)0x0;
  local_1e8.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar36 = (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->descriptor_set_in_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar36 != pbVar2) {
    local_240 = this;
LAB_001d804f:
    do {
      iVar18 = open((pbVar36->_M_dataplus)._M_p,0);
      if (iVar18 < 0) goto code_r0x001d8062;
      FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_b8,(Arena *)0x0);
      bVar15 = MessageLite::ParseFromFileDescriptor((MessageLite *)local_b8,iVar18);
      iVar18 = close(iVar18);
      if (iVar18 == 0) {
        if (!bVar15) {
          poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(pbVar36->_M_dataplus)._M_p,
                               pbVar36->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,": Unable to parse.",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
          std::ostream::put((char)poVar21);
          std::ostream::flush();
          goto LAB_001d822c;
        }
        pFVar31 = (FileDescriptor *)operator_new(0x68);
        SimpleDescriptorDatabase::SimpleDescriptorDatabase((SimpleDescriptorDatabase *)pFVar31);
        if (0 < local_90[0].current_size_) {
          iVar18 = 0;
          do {
            FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1b8,(Arena *)0x0);
            pVVar20 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                                (local_90,iVar18);
            cVar16 = (**(code **)(*(long *)pFVar31 + 0x10))
                               (pFVar31,(ulong)(pVVar20->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                        0xfffffffffffffffc,(FileDescriptorProto *)local_1b8);
            if (cVar16 == '\0') {
              pVVar20 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                                  (local_90,iVar18);
              bVar15 = SimpleDescriptorDatabase::Add((SimpleDescriptorDatabase *)pFVar31,pVVar20);
              if (!bVar15) {
                local_208._0_8_ =
                     (__uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                      )0x0;
                FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b8);
                (**(code **)(*(long *)pFVar31 + 8))(pFVar31);
                pFVar31 = (FileDescriptor *)local_208._0_8_;
                break;
              }
            }
            FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b8);
            iVar18 = iVar18 + 1;
          } while (iVar18 < local_90[0].current_size_);
        }
      }
      else {
        poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar36->_M_dataplus)._M_p,
                             pbVar36->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar21,": close: ",9);
        piVar19 = __errno_location();
        pcVar22 = strerror(*piVar19);
        if (pcVar22 == (char *)0x0) {
          std::ios::clear((int)poVar21 + (int)*(undefined8 *)(*(long *)poVar21 + -0x18));
        }
        else {
          sVar23 = strlen(pcVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21,pcVar22,sVar23);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
        std::ostream::put((char)poVar21);
        std::ostream::flush();
LAB_001d822c:
        local_208._0_8_ =
             (__uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
              )0x0;
        pFVar31 = (FileDescriptor *)local_208._0_8_;
      }
      local_208._0_8_ = pFVar31;
      FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_b8);
      if ((_Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
           )local_208._0_8_ == (SimpleDescriptorDatabase *)0x0) goto LAB_001d832f;
      std::
      vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>
                ((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
                  *)&local_1e8,
                 (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                  *)local_208);
      if ((FileDescriptor *)local_208._0_8_ != (FileDescriptor *)0x0) {
        (*((DescriptorDatabase *)local_208._0_8_)->_vptr_DescriptorDatabase[1])();
      }
      pbVar36 = pbVar36 + 1;
      if (pbVar36 == pbVar2) {
        local_1b8._0_16_ = ZEXT816(0);
        local_1b8._16_8_ = 0;
        std::
        vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
        ::reserve((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                   *)local_1b8,
                  (long)local_1e8.
                        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1e8.
                        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar14 = local_1e8.
                  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1e8.
            super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1e8.
            super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          _Var39._M_p = (__pointer_type)
                        local_1e8.
                        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_b8._0_8_ = *(undefined8 *)_Var39._M_p;
            std::
            vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
            ::emplace_back<google::protobuf::DescriptorDatabase*>
                      ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
                        *)local_1b8,(DescriptorDatabase **)local_b8);
            _Var39._M_p = _Var39._M_p + 8;
          } while (_Var39._M_p != (__pointer_type)puVar14);
        }
        this_01 = (MergedDescriptorDatabase *)operator_new(0x20);
        MergedDescriptorDatabase::MergedDescriptorDatabase
                  (this_01,(vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                            *)local_1b8);
        this = local_240;
        if ((__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
             )local_1b8._0_8_ !=
            (__uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
             )0x0) {
          operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
        }
        break;
      }
    } while( true );
  }
  local_230 = this_01;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_238 = (SourceTreeDescriptorDatabase *)0x0;
    local_258 = (DiskSourceTree *)0x0;
    bVar15 = VerifyInputFilesInDescriptors(this,&this_01->super_DescriptorDatabase);
    if (bVar15) {
      pMVar24 = (MultiFileErrorCollector *)operator_new(0x30);
      EVar1 = this->error_format_;
      pMVar24->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0056eb10;
      pMVar24[1]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0056eb60;
      pMVar24[2]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_0056eb90;
      *(ErrorFormat *)&pMVar24[3]._vptr_MultiFileErrorCollector = EVar1;
      pMVar24[4]._vptr_MultiFileErrorCollector = (_func_int **)0x0;
      *(undefined2 *)&pMVar24[5]._vptr_MultiFileErrorCollector = 0;
      if (local_248 != (MultiFileErrorCollector *)0x0) {
        ppp_Var10 = &local_248->_vptr_MultiFileErrorCollector;
        local_248 = pMVar24;
        (*(*ppp_Var10)[1])();
        pMVar24 = local_248;
      }
      local_248 = pMVar24;
      pMVar24 = local_248;
      pDVar25 = (DescriptorPool *)operator_new(0x78);
      error_collector = (ErrorCollector *)(pMVar24 + 2);
      if (pMVar24 == (MultiFileErrorCollector *)0x0) {
        error_collector = (ErrorCollector *)0x0;
      }
      DescriptorPool::DescriptorPool(pDVar25,&local_230->super_DescriptorDatabase,error_collector);
      _Var11._M_head_impl = local_250._M_head_impl;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1b8._8_8_;
      local_1b8._0_16_ = auVar9 << 0x40;
      bVar15 = local_250._M_head_impl != (DescriptorPool *)0x0;
      local_250._M_head_impl = pDVar25;
      if (bVar15) {
        DescriptorPool::~DescriptorPool(_Var11._M_head_impl);
        operator_delete(_Var11._M_head_impl,0x78);
      }
      std::
      unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
      ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                     *)local_1b8);
      local_238 = (SourceTreeDescriptorDatabase *)0x0;
      local_258 = (DiskSourceTree *)0x0;
      goto LAB_001d8636;
    }
    iVar18 = 1;
    local_258 = (DiskSourceTree *)0x0;
  }
  else {
    this_02 = (DiskSourceTree *)operator_new(0x40);
    DiskSourceTree::DiskSourceTree(this_02);
    local_238 = (SourceTreeDescriptorDatabase *)0x0;
    local_258 = this_02;
    bVar15 = InitializeDiskSourceTree(this,this_02,&local_230->super_DescriptorDatabase);
    iVar18 = 1;
    if (bVar15) {
      pMVar24 = (MultiFileErrorCollector *)operator_new(0x30);
      EVar1 = this->error_format_;
      pMVar24->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0056eb10;
      pMVar24[1]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_0056eb60;
      pMVar24[2]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_0056eb90;
      *(ErrorFormat *)&pMVar24[3]._vptr_MultiFileErrorCollector = EVar1;
      pMVar24[4]._vptr_MultiFileErrorCollector = (_func_int **)local_258;
      *(undefined2 *)&pMVar24[5]._vptr_MultiFileErrorCollector = 0;
      if (local_248 != (MultiFileErrorCollector *)0x0) {
        ppp_Var10 = &local_248->_vptr_MultiFileErrorCollector;
        local_248 = pMVar24;
        (*(*ppp_Var10)[1])();
        pMVar24 = local_248;
      }
      local_248 = pMVar24;
      this_03 = (SourceTreeDescriptorDatabase *)operator_new(0x78);
      SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
                (this_03,&local_258->super_SourceTree,&local_230->super_DescriptorDatabase);
      this_03->error_collector_ = local_248;
      this_03->using_validation_error_collector_ = true;
      pDVar25 = (DescriptorPool *)operator_new(0x78);
      local_238 = this_03;
      DescriptorPool::DescriptorPool
                (pDVar25,(DescriptorDatabase *)this_03,
                 &(this_03->validation_error_collector_).super_ErrorCollector);
      _Var11._M_head_impl = local_250._M_head_impl;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1b8._8_8_;
      local_1b8._0_16_ = auVar8 << 0x40;
      bVar15 = local_250._M_head_impl != (DescriptorPool *)0x0;
      local_250._M_head_impl = pDVar25;
      if (bVar15) {
        DescriptorPool::~DescriptorPool(_Var11._M_head_impl);
        operator_delete(_Var11._M_head_impl,0x78);
      }
      std::
      unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
      ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                     *)local_1b8);
LAB_001d8636:
      (local_250._M_head_impl)->enforce_weak_ = true;
      (local_250._M_head_impl)->enforce_naming_style_ = true;
      bVar15 = SetupFeatureResolution(this,local_250._M_head_impl);
      iVar18 = 1;
      if (bVar15) {
        if (this->mode_ == MODE_COMPILE) {
          (local_250._M_head_impl)->enforce_extension_declarations_ = kCustomExtensions;
        }
        bVar15 = ParseInputFiles(this,local_250._M_head_impl,source_tree,&local_228);
        ppFVar12 = local_228.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar15) {
          local_259 = ~kSentinel;
          local_240 = this;
          if (local_228.
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_228.
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pCVar32 = (Chunk *)local_228.
                               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
            do {
              pFVar31 = (FileDescriptor *)pCVar32->next;
              local_1b8._8_8_ = (slot_type *)&local_248;
              local_1b8._0_8_ = &local_259;
              if (0 < pFVar31->message_type_count_) {
                lVar37 = 0;
                lVar34 = 0;
                do {
                  internal::
                  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
                  ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
                             *)local_1b8,
                            (Descriptor *)(&pFVar31->message_types_->super_SymbolBase + lVar37));
                  lVar34 = lVar34 + 1;
                  lVar37 = lVar37 + 0xa0;
                } while (lVar34 < pFVar31->message_type_count_);
              }
              if (0 < pFVar31->extension_count_) {
                lVar37 = 0;
                lVar34 = 0;
                do {
                  internal::
                  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1274:16)>_>
                  ::Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1274:16)>_>
                             *)local_1b8,
                            (FieldDescriptor *)(&pFVar31->extensions_->super_SymbolBase + lVar37));
                  lVar34 = lVar34 + 1;
                  lVar37 = lVar37 + 0x58;
                } while (lVar34 < pFVar31->extension_count_);
              }
              pCVar32 = (Chunk *)&pCVar32->size;
            } while (pCVar32 != (Chunk *)ppFVar12);
            local_1c8 = (Chunk *)local_228.
                                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
            pCVar32 = (Chunk *)local_228.
                               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_start;
            if (local_228.
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_228.
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                local_208._0_8_ = pCVar32->next;
                FileDescriptorProto::FileDescriptorProto
                          ((FileDescriptorProto *)local_1b8,(Arena *)0x0);
                FileDescriptor::CopyTo
                          ((FileDescriptor *)local_208._0_8_,(FileDescriptorProto *)local_1b8);
                uVar13 = local_208._0_8_;
                local_b8._0_8_ = &local_250;
                local_b8._8_8_ = &local_248;
                local_b8._16_8_ = local_208;
                local_b8._24_8_ = &local_259;
                puVar35 = (undefined1 *)local_f0[3];
                if (local_f0[3].tagged_ptr_.ptr_ == (void *)0x0) {
                  puVar35 = _FileOptions_default_instance_;
                }
                pnVar3 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                          (local_208._0_8_ + 8))->by_name_).
                         super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                         .
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                         .tree_.root_;
                file_name._M_str = (char *)0x1;
                file_name._M_len = *(size_t *)pnVar3;
                bVar15 = anon_unknown_5::ValidateTargetConstraints
                                   ((anon_unknown_5 *)puVar35,(Message *)local_250._M_head_impl,
                                    (DescriptorPool *)(local_248 + 2),
                                    *(ErrorCollector **)(pnVar3 + 8),file_name,
                                    in_stack_fffffffffffffd98);
                if (!bVar15) {
                  local_259 = ~kDeleted;
                }
                local_1c0 = pCVar32;
                if (0 < *(int *)(uVar13 + 0x3c)) {
                  lVar34 = 0;
                  lVar37 = 0;
                  do {
                    pDVar4 = *(Descriptor **)(uVar13 + 0x60);
                    proto = internal::RepeatedPtrFieldBase::
                            Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                                      ((RepeatedPtrFieldBase *)(local_1b8 + 0x30),(int)lVar37);
                    internal::
                    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
                    ::Visit<google::protobuf::DescriptorProto>
                              ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
                                *)local_b8,
                               (Descriptor *)
                               ((long)&(((__uniq_ptr_data<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>,_true,_true>
                                          *)&pDVar4->super_SymbolBase)->
                                       super___uniq_ptr_impl<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>
                                       )._M_t.
                                       super__Tuple_impl<0UL,_const_google::protobuf::FileDescriptorProto_*,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>
                                       .
                                       super__Head_base<0UL,_const_google::protobuf::FileDescriptorProto_*,_false>
                                       ._M_head_impl + lVar34),proto);
                    lVar37 = lVar37 + 1;
                    lVar34 = lVar34 + 0xa0;
                  } while (lVar37 < *(int *)(uVar13 + 0x3c));
                }
                if (0 < *(int *)&(((CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>
                                    *)(uVar13 + 0x40))->
                                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                 ).
                                 super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*,_2UL,_false>
                                 .value) {
                  lVar34 = 0;
                  lVar37 = 0;
                  do {
                    pp_Var5 = (((SimpleDescriptorDatabase *)(uVar13 + 0x68))->
                              super_DescriptorDatabase)._vptr_DescriptorDatabase;
                    proto_00 = internal::RepeatedPtrFieldBase::
                               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                                         (&local_170,(int)lVar37);
                    internal::
                    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
                    ::Visit<google::protobuf::EnumDescriptorProto>
                              ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
                                *)local_b8,(EnumDescriptor *)((long)pp_Var5 + lVar34),proto_00);
                    lVar37 = lVar37 + 1;
                    lVar34 = lVar34 + 0x58;
                  } while (lVar37 < *(int *)&(((CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>
                                                *)(uVar13 + 0x40))->
                                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>::checked_compare,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                             ).
                                             super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_*,_2UL,_false>
                                             .value);
                }
                if (0 < *(int *)(uVar13 + 4)) {
                  iVar18 = 0;
                  do {
                    pVVar26 = internal::RepeatedPtrFieldBase::
                              Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                        (local_140,iVar18);
                    internal::
                    VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
                    ::Visit<google::protobuf::FieldDescriptorProto>
                              ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
                                *)local_b8,(FieldDescriptor *)(pVVar26->field_0)._impl_.options_,
                               proto_01);
                    iVar18 = iVar18 + 1;
                  } while (iVar18 < *(int *)(uVar13 + 4));
                }
                if (0 < *(int *)(uVar13 + 0x44)) {
                  lVar34 = 0;
                  do {
                    pnVar3 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                              (uVar13 + 0x70))->by_name_).
                             super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                             .
                             super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                             .
                             super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                             .tree_.root_;
                    pVVar27 = internal::RepeatedPtrFieldBase::
                              Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                        (&local_158,(int)lVar34);
                    puVar35 = (undefined1 *)(pVVar27->field_0)._impl_.options_;
                    if ((ServiceOptions *)puVar35 == (ServiceOptions *)0x0) {
                      puVar35 = _ServiceOptions_default_instance_;
                    }
                    pnVar6 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *)
                              (local_208._0_8_ + 8))->by_name_).
                             super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                             .
                             super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                             .
                             super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                             .tree_.root_;
                    file_name_00._M_str = (char *)0x8;
                    file_name_00._M_len = *(size_t *)pnVar6;
                    bVar15 = anon_unknown_5::ValidateTargetConstraints
                                       ((anon_unknown_5 *)puVar35,(Message *)local_250._M_head_impl,
                                        (DescriptorPool *)(local_248 + 2),
                                        *(ErrorCollector **)(pnVar6 + 8),file_name_00,
                                        in_stack_fffffffffffffd98);
                    if (!bVar15) {
                      local_259 = ~kDeleted;
                    }
                    if (0 < *(int *)(pnVar3 + lVar34 * 0x40 + 0x38)) {
                      iVar18 = 0;
                      do {
                        pVVar28 = internal::RepeatedPtrFieldBase::
                                  Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                            (&(pVVar27->field_0)._impl_.method_.
                                              super_RepeatedPtrFieldBase,iVar18);
                        puVar35 = (undefined1 *)(pVVar28->field_0)._impl_.options_;
                        if ((MethodOptions *)puVar35 == (MethodOptions *)0x0) {
                          puVar35 = _MethodOptions_default_instance_;
                        }
                        pnVar6 = (((DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *
                                   )(local_208._0_8_ + 8))->by_name_).
                                 super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                                 .
                                 super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                                 .
                                 super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>_>
                                 .tree_.root_;
                        file_name_01._M_str = (char *)0x9;
                        file_name_01._M_len = *(size_t *)pnVar6;
                        bVar15 = anon_unknown_5::ValidateTargetConstraints
                                           ((anon_unknown_5 *)puVar35,
                                            (Message *)local_250._M_head_impl,
                                            (DescriptorPool *)(local_248 + 2),
                                            *(ErrorCollector **)(pnVar6 + 8),file_name_01,
                                            in_stack_fffffffffffffd98);
                        if (!bVar15) {
                          local_259 = ~kDeleted;
                        }
                        iVar18 = iVar18 + 1;
                      } while (iVar18 < *(int *)(pnVar3 + lVar34 * 0x40 + 0x38));
                    }
                    lVar34 = lVar34 + 1;
                  } while (lVar34 < *(int *)(uVar13 + 0x44));
                }
                FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b8);
                pCVar32 = (Chunk *)&local_1c0->size;
              } while ((Chunk *)&local_1c0->size != local_1c8);
            }
          }
          pCVar40 = local_240;
          iVar18 = 1;
          if (local_259 == ~kSentinel) {
            bVar15 = EnforceProtocEditionsSupport(local_240,&local_228);
            if (bVar15) {
              local_208._0_8_ =
                   (__uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                    )0x0;
              local_208._8_8_ = 0;
              local_208._16_8_ = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
              if ((pCVar40->mode_ == MODE_COMPILE) &&
                 (pOVar29 = (local_240->output_directives_).
                            super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 (local_240->output_directives_).
                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                 ._M_impl.super__Vector_impl_data._M_finish != pOVar29)) {
                lVar34 = 0;
                uVar38 = 0;
                do {
                  local_1b8._0_8_ = (long)local_1b8 + 0x10;
                  lVar37 = *(long *)((long)&(pOVar29->output_location)._M_dataplus._M_p + lVar34);
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_1b8,lVar37,
                             *(long *)((long)&(pOVar29->output_location)._M_string_length + lVar34)
                             + lVar37);
                  if ((ulong)local_1b8._8_8_ < (slot_type *)0x4) {
                    if ((slot_type *)local_1b8._8_8_ != (slot_type *)0x0) {
LAB_001d8c40:
                      if (((ctrl_t *)(local_1b8._0_8_ + -1))[local_1b8._8_8_] != 0x2f) {
                        std::__cxx11::string::push_back
                                  ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_1b8);
                      }
                    }
                  }
                  else if (((*(undefined4 *)((ctrl_t *)(local_1b8._0_8_ + -4) + local_1b8._8_8_) !=
                             0x70697a2e) &&
                           (*(undefined4 *)((ctrl_t *)(local_1b8._0_8_ + -4) + local_1b8._8_8_) !=
                            0x72616a2e)) &&
                          (((ulong)local_1b8._8_8_ < (slot_type *)0x7 ||
                           (*(undefined4 *)((ctrl_t *)(local_1b8._0_8_ + -4) + local_1b8._8_8_) !=
                            0x72616a63 ||
                            *(undefined4 *)((ctrl_t *)(local_1b8._0_8_ + -7) + local_1b8._8_8_) !=
                            0x6372732e)))) goto LAB_001d8c40;
                  absl::lts_20250127::container_internal::
                  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>>>>>
                  ::try_emplace_impl<std::__cxx11::string_const&>
                            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>::iterator,_bool>
                              *)local_b8,local_208,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1b8);
                  uVar13 = local_b8._8_8_;
                  generator_context = *(GeneratorContext **)(local_b8._8_8_ + 0x20);
                  if (generator_context == (GeneratorContext *)0x0) {
                    generator_context = (GeneratorContext *)operator_new(0x30);
                    generator_context->_vptr_GeneratorContext =
                         (_func_int **)&PTR__GeneratorContextImpl_0056e9d8;
                    generator_context[1]._vptr_GeneratorContext =
                         (_func_int **)
                         absl::lts_20250127::container_internal::
                         btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                         ::EmptyNode()::empty_node_abi_cxx11_;
                    generator_context[2]._vptr_GeneratorContext =
                         (_func_int **)
                         absl::lts_20250127::container_internal::
                         btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
                         ::EmptyNode()::empty_node_abi_cxx11_;
                    generator_context[3]._vptr_GeneratorContext = (_func_int **)0x0;
                    generator_context[4]._vptr_GeneratorContext = (_func_int **)&local_228;
                    *(undefined1 *)&generator_context[5]._vptr_GeneratorContext = 0;
                    pMVar24 = *(MultiFileErrorCollector **)(uVar13 + 0x20);
                    *(GeneratorContext **)(uVar13 + 0x20) = generator_context;
                    if (pMVar24 != (MultiFileErrorCollector *)0x0) {
                      (*pMVar24->_vptr_MultiFileErrorCollector[1])();
                      generator_context = *(GeneratorContext **)(uVar13 + 0x20);
                    }
                  }
                  bVar15 = GenerateOutput(local_240,&local_228,
                                          (OutputDirective *)
                                          ((long)&(((local_240->output_directives_).
                                                                                                        
                                                  super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->name).
                                                  _M_dataplus._M_p + lVar34),generator_context);
                  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
                    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
                  }
                  if (!bVar15) goto LAB_001d8ec0;
                  uVar38 = uVar38 + 1;
                  pOVar29 = (local_240->output_directives_).
                            super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar34 = lVar34 + 0x68;
                } while (uVar38 < (ulong)(((long)(local_240->output_directives_).
                                                 super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pOVar29 >> 3) * 0x4ec4ec4ec4ec4ec5));
              }
              local_1b8._0_16_ =
                   (undefined1  [16])
                   absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                   ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                            *)local_208);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                          *)local_208);
              local_b8._0_8_ = (_Head_base<0UL,_google::protobuf::DescriptorPool_*,_false> *)0x0;
              while (pCVar40 = local_240,
                    bVar15 = absl::lts_20250127::container_internal::operator==
                                       ((iterator *)local_1b8,(iterator *)local_b8), !bVar15) {
                filename = absl::lts_20250127::container_internal::
                           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                           ::iterator::operator*((iterator *)local_1b8);
                this_00 = (filename->second)._M_t.
                          super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                          .
                          super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                          ._M_head_impl;
                uVar38 = (filename->first)._M_string_length;
                if (uVar38 == 0) {
LAB_001d8ab0:
                  bVar15 = GeneratorContextImpl::WriteAllToZip(this_00,&filename->first);
                }
                else {
                  pcVar7 = (filename->first)._M_dataplus._M_p;
                  if (pcVar7[uVar38 - 1] != '/') {
                    if ((3 < uVar38) && (*(int *)(pcVar7 + (uVar38 - 4)) == 0x72616a2e)) {
                      GeneratorContextImpl::AddJarManifest(this_00);
                    }
                    goto LAB_001d8ab0;
                  }
                  bVar15 = GeneratorContextImpl::WriteAllToDisk(this_00,&filename->first);
                }
                if (bVar15 == false) goto LAB_001d8ec0;
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                ::iterator::operator++((iterator *)local_1b8);
              }
              if ((pCVar40->dependency_out_name_)._M_string_length != 0) {
                if (local_258 == (DiskSourceTree *)0x0) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)local_1b8,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                             ,0x55f,"disk_source_tree.get()");
                  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                            ((LogMessageFatal *)local_1b8);
                }
                bVar15 = GenerateDependencyManifestFile
                                   (pCVar40,&local_228,(GeneratorContextMap *)local_208,local_258);
                iVar18 = 1;
                if (bVar15) goto LAB_001d8b1c;
                goto LAB_001d8ec5;
              }
LAB_001d8b1c:
              if ((pCVar40->descriptor_set_out_name_)._M_string_length != 0) {
                bVar15 = WriteDescriptorSet(pCVar40,&local_228);
                iVar18 = 1;
                if (!bVar15) goto LAB_001d8ec5;
              }
              if ((pCVar40->edition_defaults_out_name_)._M_string_length != 0) {
                bVar15 = WriteEditionDefaults(pCVar40,local_250._M_head_impl);
                iVar18 = 1;
                if (!bVar15) goto LAB_001d8ec5;
              }
              if (pCVar40->mode_ - MODE_ENCODE < 2) {
                if ((pCVar40->codec_type_)._M_string_length == 0) {
                  DescriptorPool::DescriptorPool((DescriptorPool *)local_b8);
                  FileDescriptorProto::FileDescriptorProto
                            ((FileDescriptorProto *)local_1b8,(Arena *)0x0);
                  local_1b8._16_8_ = local_1b8._16_8_ | 1;
                  arena = (anon_union_8_1_a8a14541_for_iterator_2)local_1b8._8_8_;
                  if ((local_1b8._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    arena = (anon_union_8_1_a8a14541_for_iterator_2)
                            ((anon_union_8_1_a8a14541_for_iterator_2 *)
                            (local_1b8._8_8_ & 0xfffffffffffffffe))->slot_;
                  }
                  value._M_str = "empty_message.proto";
                  value._M_len = 0x13;
                  internal::ArenaStringPtr::Set(local_f0,value,(Arena *)arena.slot_);
                  pvVar30 = internal::RepeatedPtrFieldBase::AddMessageLite
                                      ((RepeatedPtrFieldBase *)(local_1b8 + 0x30),
                                       Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
                  *(byte *)((long)pvVar30 + 0x10) = *(byte *)((long)pvVar30 + 0x10) | 1;
                  arena_00 = *(Arena **)((long)pvVar30 + 8);
                  if (((ulong)arena_00 & 1) != 0) {
                    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
                  }
                  value_00._M_str = "EmptyMessage";
                  value_00._M_len = 0xc;
                  internal::ArenaStringPtr::Set
                            ((ArenaStringPtr *)((long)pvVar30 + 0xd8),value_00,arena_00);
                  pCVar40 = local_240;
                  pFVar31 = DescriptorPool::BuildFile
                                      ((DescriptorPool *)local_b8,(FileDescriptorProto *)local_1b8);
                  if (pFVar31 == (FileDescriptor *)0x0) {
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              (&local_40,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                               ,0x579,"pool.BuildFile(file) != nullptr");
                    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
                  }
                  std::__cxx11::string::operator=((string *)&pCVar40->codec_type_,"EmptyMessage");
                  bVar15 = EncodeOrDecode(pCVar40,(DescriptorPool *)local_b8);
                  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1b8);
                  DescriptorPool::~DescriptorPool((DescriptorPool *)local_b8);
                  iVar18 = 1;
                  if (bVar15) goto LAB_001d8e41;
                }
                else {
                  bVar15 = EncodeOrDecode(pCVar40,local_250._M_head_impl);
                  iVar18 = 1;
                  if (bVar15) goto LAB_001d8e41;
                }
              }
              else {
LAB_001d8e41:
                iVar18 = 1;
                if ((*(char *)&local_248[5]._vptr_MultiFileErrorCollector == '\0') &&
                   ((pCVar40->fatal_warnings_ != true ||
                    (*(char *)((long)&local_248[5]._vptr_MultiFileErrorCollector + 1) == '\0')))) {
                  iVar18 = 0;
                  if (pCVar40->mode_ == MODE_PRINT) {
                    iVar18 = 0;
                    if (pCVar40->print_mode_ == PRINT_FREE_FIELDS) {
                      if (local_228.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          local_228.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        uVar38 = 0;
                        pCVar32 = (Chunk *)local_228.
                                           super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                        pCVar33 = (Chunk *)local_228.
                                           super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                        do {
                          pFVar31 = (FileDescriptor *)(&pCVar32->next)[uVar38];
                          if (0 < pFVar31->message_type_count_) {
                            lVar37 = 0;
                            lVar34 = 0;
                            do {
                              PrintFreeFieldNumbers
                                        (local_240,
                                         (Descriptor *)
                                         (&pFVar31->message_types_->super_SymbolBase + lVar37));
                              lVar34 = lVar34 + 1;
                              lVar37 = lVar37 + 0xa0;
                              pCVar32 = (Chunk *)local_228.
                                                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                              pCVar33 = (Chunk *)local_228.
                                                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish;
                            } while (lVar34 < pFVar31->message_type_count_);
                          }
                          uVar38 = uVar38 + 1;
                          iVar18 = 0;
                        } while (uVar38 < (ulong)((long)pCVar33 - (long)pCVar32 >> 3));
                      }
                    }
                    else if (pCVar40->print_mode_ == PRINT_NONE) {
                      absl::lts_20250127::log_internal::LogMessage::LogMessage
                                ((LogMessage *)local_1b8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                                 ,0x595);
                      str._M_str = 
                      "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
                      ;
                      str._M_len = 0x5d;
                      absl::lts_20250127::log_internal::LogMessage::
                      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                                ((LogMessage *)local_1b8,str);
                      absl::lts_20250127::log_internal::LogMessage::~LogMessage
                                ((LogMessage *)local_1b8);
LAB_001d8ec0:
                      iVar18 = 1;
                    }
                  }
                }
              }
LAB_001d8ec5:
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
              ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                               *)local_208);
            }
          }
        }
      }
      if (local_238 != (SourceTreeDescriptorDatabase *)0x0) {
        (*(local_238->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
      }
    }
  }
  if (local_230 != (MergedDescriptorDatabase *)0x0) {
    (*(local_230->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
  }
LAB_001d8eef:
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector(&local_1e8);
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&local_250);
  if (local_248 != (MultiFileErrorCollector *)0x0) {
    (*local_248->_vptr_MultiFileErrorCollector[1])();
  }
  if (local_258 != (DiskSourceTree *)0x0) {
    (*(local_258->super_SourceTree)._vptr_SourceTree[1])();
  }
  if ((Chunk *)local_228.
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start != (Chunk *)0x0) {
    operator_delete(local_228.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar18;
code_r0x001d8062:
  piVar19 = __errno_location();
  if (*piVar19 != 4) goto LAB_001d829a;
  goto LAB_001d804f;
LAB_001d829a:
  poVar21 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(pbVar36->_M_dataplus)._M_p,pbVar36->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar21,": ",2);
  pcVar22 = strerror(2);
  if (pcVar22 == (char *)0x0) {
    std::ios::clear((int)poVar21 + (int)*(undefined8 *)(*(long *)poVar21 + -0x18));
  }
  else {
    sVar23 = strlen(pcVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar21,pcVar22,sVar23);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
  std::ostream::put((char)poVar21);
  std::ostream::flush();
LAB_001d832f:
  iVar18 = 1;
  local_258 = (DiskSourceTree *)0x0;
  goto LAB_001d8eef;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();

  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database = std::make_unique<MergedDescriptorDatabase>(
        raw_databases_per_descriptor_set);
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector = std::make_unique<ErrorPrinter>(error_format_);
    descriptor_pool = std::make_unique<DescriptorPool>(
        descriptor_set_in_database.get(), error_collector.get());
  } else {
    disk_source_tree = std::make_unique<DiskSourceTree>();
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector =
        std::make_unique<ErrorPrinter>(error_format_, disk_source_tree.get());

    source_tree_database = std::make_unique<SourceTreeDescriptorDatabase>(
        disk_source_tree.get(), descriptor_set_in_database.get());
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool = std::make_unique<DescriptorPool>(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector());
  }

  descriptor_pool->EnforceWeakDependencies(true);
  descriptor_pool->EnforceNamingStyle(true);

  if (!SetupFeatureResolution(*descriptor_pool)) {
    return EXIT_FAILURE;
  }

  // Enforce extension declarations only when compiling. We want to skip this
  // enforcement when protoc is just being invoked to encode or decode
  // protos. If allowlist is disabled, we will not check for descriptor
  // extensions declarations, either.
  if (mode_ == MODE_COMPILE) {
      descriptor_pool->EnforceExtensionDeclarations(
          ExtDeclEnforcementLevel::kCustomExtensions);
  }
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }

  bool validation_error = false;  // Defer exiting so we log more warnings.

  for (auto& file : parsed_files) {
    google::protobuf::internal::VisitDescriptors(
        *file, [&](const FieldDescriptor& field) {
          if (HasReservedFieldNumber(&field)) {
            const char* error_link = nullptr;
            validation_error = true;
            std::string error;
            if (field.number() >= FieldDescriptor::kFirstReservedNumber &&
                field.number() <= FieldDescriptor::kLastReservedNumber) {
              error = absl::Substitute(
                  "Field numbers $0 through $1 are reserved "
                  "for the protocol buffer library implementation.",
                  FieldDescriptor::kFirstReservedNumber,
                  FieldDescriptor::kLastReservedNumber);
            } else {
              error = absl::Substitute(
                  "Field number $0 is reserved for specific purposes.",
                  field.number());
            }
            if (error_link) {
              absl::StrAppend(&error, "(See ", error_link, ")");
            }
            static_cast<DescriptorPool::ErrorCollector*>(error_collector.get())
                ->RecordError(field.file()->name(), field.full_name(), nullptr,
                              DescriptorPool::ErrorCollector::NUMBER, error);
          }
        });
  }

  // We visit one file at a time because we need to provide the file name for
  // error messages. Usually we can get the file name from any descriptor with
  // something like descriptor->file()->name(), but ExtensionRange does not
  // support this.
  for (const google::protobuf::FileDescriptor* file : parsed_files) {
    FileDescriptorProto proto;
    file->CopyTo(&proto);
    google::protobuf::internal::VisitDescriptors(
        *file, proto, [&](const auto& descriptor, const auto& proto) {
          if (!ValidateTargetConstraints(proto.options(), *descriptor_pool,
                                         *error_collector, file->name(),
                                         GetTargetType(&descriptor))) {
            validation_error = true;
          }
        });
  }


  if (validation_error) {
    return 1;
  }

  if (!EnforceProtocEditionsSupport(parsed_files)) {
    return 1;
  }

  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (size_t i = 0; i < output_directives_.size(); ++i) {
      std::string output_location = output_directives_[i].output_location;
      if (!absl::EndsWith(output_location, ".zip") &&
          !absl::EndsWith(output_location, ".jar") &&
          !absl::EndsWith(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator = std::make_unique<GeneratorContextImpl>(parsed_files);
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (absl::EndsWith(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (absl::EndsWith(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    ABSL_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (!edition_defaults_out_name_.empty()) {
    if (!WriteEditionDefaults(*descriptor_pool)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      ABSL_CHECK(pool.BuildFile(file) != nullptr);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (size_t i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        ABSL_LOG(ERROR)
            << "If the code reaches here, it usually means a bug of "
               "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }
  return 0;
}